

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

size_t __thiscall
ddd::DaTrie<false,_true,_false>::edge_size_
          (DaTrie<false,_true,_false> *this,uint32_t node_pos,size_t upper)

{
  byte bVar1;
  uint8_t uVar2;
  bool bVar3;
  uint32_t uVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  ulong in_RDX;
  uint in_ESI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t child_pos;
  size_t size;
  uint32_t base;
  uint local_34;
  ulong local_30;
  size_t local_8;
  
  pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
  bVar3 = Bc::is_leaf(pvVar5);
  if (bVar3) {
    local_8 = 0;
  }
  else {
    pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
    uVar4 = Bc::base(pvVar5);
    if (uVar4 == 0x7fffffff) {
      local_8 = 0;
    }
    else {
      local_30 = 0;
      pvVar6 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                         ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                          (ulong)in_ESI);
      bVar1 = pvVar6->child;
      while( true ) {
        local_34 = uVar4 ^ bVar1;
        local_30 = local_30 + 1;
        bVar3 = false;
        if (local_30 < in_RDX) {
          pvVar6 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                             ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                              (ulong)local_34);
          uVar2 = pvVar6->sib;
          pvVar6 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                             ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                              (ulong)in_ESI);
          bVar3 = uVar2 != pvVar6->child;
        }
        local_8 = local_30;
        if (!bVar3) break;
        pvVar6 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                           ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                            (ulong)local_34);
        bVar1 = pvVar6->sib;
      }
    }
  }
  return local_8;
}

Assistant:

size_t edge_size_(uint32_t node_pos, size_t upper = 256) const {
    assert(bc_[node_pos].is_fixed());

    if (bc_[node_pos].is_leaf()) {
      return 0;
    }

    auto base = bc_[node_pos].base();
    if (base == INVALID_VALUE) { // for prefix subtrie
      return 0;
    }

    size_t size = 0;
    if (WithNLM) {
      auto child_pos = base ^node_links_[node_pos].child;
      while (++size < upper && node_links_[child_pos].sib != node_links_[node_pos].child) {
        child_pos = base ^ node_links_[child_pos].sib;
      }
    } else {
      for (uint32_t label = 0; label < 256; ++label) {
        auto child_pos = base ^label;
        if (bc_[child_pos].check() == node_pos && ++size >= upper) {
          break;
        }
      }
    }
    return size;
  }